

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

double __thiscall blc::math::Float::calculate(Float *this)

{
  double ret;
  int tmp;
  Float *this_local;
  
  tmp = this->_E;
  ret = this->_nb;
  while (tmp != 0) {
    if (tmp < 0) {
      ret = ret / 10.0;
      tmp = tmp + 1;
    }
    else {
      ret = ret * 10.0;
      tmp = tmp + -1;
    }
  }
  return ret;
}

Assistant:

double blc::math::Float::calculate() const {
	int	tmp = this->_E;
	double	ret = this->_nb;

	while (tmp != 0) {
		if (tmp < 0) {
			ret /= 10;
			tmp++;
		} else {
			ret *= 10;
			tmp--;
		}
	}
	return (ret);
}